

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcborcommon.cpp
# Opt level: O2

QString * __thiscall QCborError::toString(QString *__return_storage_ptr__,QCborError *this)

{
  int iVar1;
  char16_t *pcVar2;
  storage_type *psVar3;
  long in_FS_OFFSET;
  QByteArrayView ba;
  QByteArrayView local_40;
  QArrayDataPointer<char16_t> local_30;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  iVar1 = *(int *)this;
  switch(iVar1) {
  case 0x100:
    (__return_storage_ptr__->d).d = (Data *)0x0;
    (__return_storage_ptr__->d).ptr = L"Data found after the end of the stream";
    (__return_storage_ptr__->d).size = 0x26;
    break;
  case 0x101:
    (__return_storage_ptr__->d).d = (Data *)0x0;
    (__return_storage_ptr__->d).ptr = L"Unexpected end of input data (more bytes needed)";
    (__return_storage_ptr__->d).size = 0x30;
    break;
  case 0x102:
    (__return_storage_ptr__->d).d = (Data *)0x0;
    (__return_storage_ptr__->d).ptr = L"Invalid CBOR stream: unexpected \'break\' byte";
    (__return_storage_ptr__->d).size = 0x2c;
    break;
  case 0x103:
    (__return_storage_ptr__->d).d = (Data *)0x0;
    (__return_storage_ptr__->d).ptr = L"Invalid CBOR stream: unknown type";
    (__return_storage_ptr__->d).size = 0x21;
    break;
  case 0x104:
    (__return_storage_ptr__->d).d = (Data *)0x0;
    pcVar2 = L"Invalid CBOR stream: illegal type found";
LAB_002b1fbf:
    (__return_storage_ptr__->d).ptr = pcVar2;
    (__return_storage_ptr__->d).size = 0x27;
    break;
  case 0x105:
    (__return_storage_ptr__->d).d = (Data *)0x0;
    (__return_storage_ptr__->d).ptr =
         L"Invalid CBOR stream: illegal number encoding (future extension)";
    (__return_storage_ptr__->d).size = 0x3f;
    break;
  case 0x106:
    (__return_storage_ptr__->d).d = (Data *)0x0;
    (__return_storage_ptr__->d).ptr = L"Invalid CBOR stream: illegal simple type";
    (__return_storage_ptr__->d).size = 0x28;
    break;
  default:
    switch(iVar1) {
    case 0:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
        (__return_storage_ptr__->d).d = (Data *)0x0;
        (__return_storage_ptr__->d).ptr = (char16_t *)0x0;
        (__return_storage_ptr__->d).size = 0;
        return __return_storage_ptr__;
      }
      goto LAB_002b2135;
    case 1:
      (__return_storage_ptr__->d).d = (Data *)0x0;
      (__return_storage_ptr__->d).ptr = L"Unknown error";
      (__return_storage_ptr__->d).size = 0xd;
      break;
    case 2:
switchD_002b1d65_caseD_2:
      if (iVar1 - 0x200U < 0xc) {
        psVar3 = (storage_type *)
                 ((long)&switchD_002b1e36::switchdataD_00471ee4 +
                 (long)(int)(&switchD_002b1e36::switchdataD_00471ee4)[iVar1 - 0x200U]);
        switch(iVar1) {
        case 0x200:
          local_30.d = (Data *)0x472650;
          break;
        case 0x201:
          local_30.d = (Data *)0x472664;
          break;
        case 0x202:
          local_30.d = (Data *)0x472670;
          break;
        case 0x203:
          local_30.d = (Data *)0x47268b;
          break;
        case 0x204:
switchD_002b1e36_caseD_204:
          local_30.d = (Data *)0x4725a2;
          break;
        case 0x205:
          local_30.d = (Data *)0x4726a4;
          break;
        case 0x206:
          local_30.d = (Data *)0x4726b8;
          break;
        default:
          local_30.d = (Data *)0x4726cd;
          break;
        case 0x209:
switchD_002b1e36_caseD_209:
          local_30.d = (Data *)0x4726f1;
          break;
        case 0x20a:
          local_30.d = (Data *)0x47270c;
          break;
        case 0x20b:
          local_30.d = (Data *)0x47271e;
        }
      }
      else {
        psVar3 = (storage_type *)(ulong)(uint)-iVar1;
        if (iVar1 == 0x7fffffff) {
          local_30.d = (Data *)0x47281f;
        }
        else if (iVar1 == 0x107) {
          local_30.d = (Data *)0x472629;
        }
        else if (iVar1 == 0x300) {
          local_30.d = (Data *)0x472736;
        }
        else if (iVar1 == 0x301) {
          local_30.d = (Data *)0x472756;
        }
        else if (iVar1 == 0x403) {
          local_30.d = (Data *)0x472775;
        }
        else if (iVar1 == 0x500) {
          local_30.d = (Data *)0x4727ad;
        }
        else {
          if (iVar1 == 0x501) goto switchD_002b1e36_caseD_209;
          if (iVar1 == 0x502) {
            local_30.d = (Data *)0x4727e9;
          }
          else {
            if (iVar1 != 2) goto switchD_002b1e36_caseD_204;
            local_30.d = (Data *)0x4725cf;
          }
        }
      }
      QByteArrayView::QByteArrayView<const_char_*,_true>(&local_40,(char **)&local_30);
      ba.m_data = psVar3;
      ba.m_size = (qsizetype)local_40.m_data;
      QString::fromLatin1(__return_storage_ptr__,(QString *)local_40.m_size,ba);
      goto LAB_002b1fd5;
    case 3:
      (__return_storage_ptr__->d).d = (Data *)0x0;
      (__return_storage_ptr__->d).ptr = L"Read past end of buffer (more bytes needed)";
      (__return_storage_ptr__->d).size = 0x2b;
      break;
    case 4:
      (__return_storage_ptr__->d).d = (Data *)0x0;
      (__return_storage_ptr__->d).ptr = L"Input/Output error";
      (__return_storage_ptr__->d).size = 0x12;
      break;
    default:
      if (iVar1 == 0x204) {
        (__return_storage_ptr__->d).d = (Data *)0x0;
        (__return_storage_ptr__->d).ptr = L"Invalid CBOR stream: invalid UTF-8 text string";
        (__return_storage_ptr__->d).size = 0x2e;
      }
      else {
        if (iVar1 == 0x400) {
          (__return_storage_ptr__->d).d = (Data *)0x0;
          pcVar2 = L"Internal limitation: data set too large";
          goto LAB_002b1fbf;
        }
        if (iVar1 == 0x401) {
          (__return_storage_ptr__->d).d = (Data *)0x0;
          (__return_storage_ptr__->d).ptr = L"Internal limitation: data nesting too deep";
          (__return_storage_ptr__->d).size = 0x2a;
        }
        else {
          if (iVar1 != 0x402) goto switchD_002b1d65_caseD_2;
          (__return_storage_ptr__->d).d = (Data *)0x0;
          (__return_storage_ptr__->d).ptr = L"Internal limitation: unsupported type";
          (__return_storage_ptr__->d).size = 0x25;
        }
      }
    }
  }
  local_30.size = 0;
  local_30.ptr = (char16_t *)0x0;
  local_30.d = (Data *)0x0;
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_30);
LAB_002b1fd5:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return __return_storage_ptr__;
  }
LAB_002b2135:
  __stack_chk_fail();
}

Assistant:

QString QCborError::toString() const
{
    switch (c) {
    case NoError:
        static_assert(int(NoError) == int(CborNoError));
        return QString();

    case UnknownError:
        static_assert(int(UnknownError) == int(CborUnknownError));
        return QStringLiteral("Unknown error");
    case AdvancePastEnd:
        static_assert(int(AdvancePastEnd) == int(CborErrorAdvancePastEOF));
        return QStringLiteral("Read past end of buffer (more bytes needed)");
    case InputOutputError:
        static_assert(int(InputOutputError) == int(CborErrorIO));
        return QStringLiteral("Input/Output error");
    case GarbageAtEnd:
        static_assert(int(GarbageAtEnd) == int(CborErrorGarbageAtEnd));
        return QStringLiteral("Data found after the end of the stream");
    case EndOfFile:
        static_assert(int(EndOfFile) == int(CborErrorUnexpectedEOF));
        return QStringLiteral("Unexpected end of input data (more bytes needed)");
    case UnexpectedBreak:
        static_assert(int(UnexpectedBreak) == int(CborErrorUnexpectedBreak));
        return QStringLiteral("Invalid CBOR stream: unexpected 'break' byte");
    case UnknownType:
        static_assert(int(UnknownType) == int(CborErrorUnknownType));
        return QStringLiteral("Invalid CBOR stream: unknown type");
    case IllegalType:
        static_assert(int(IllegalType) == int(CborErrorIllegalType));
        return QStringLiteral("Invalid CBOR stream: illegal type found");
    case IllegalNumber:
        static_assert(int(IllegalNumber) == int(CborErrorIllegalNumber));
        return QStringLiteral("Invalid CBOR stream: illegal number encoding (future extension)");
    case IllegalSimpleType:
        static_assert(int(IllegalSimpleType) == int(CborErrorIllegalSimpleType));
        return QStringLiteral("Invalid CBOR stream: illegal simple type");
    case InvalidUtf8String:
        static_assert(int(InvalidUtf8String) == int(CborErrorInvalidUtf8TextString));
        return QStringLiteral("Invalid CBOR stream: invalid UTF-8 text string");
    case DataTooLarge:
        static_assert(int(DataTooLarge) == int(CborErrorDataTooLarge));
        return QStringLiteral("Internal limitation: data set too large");
    case NestingTooDeep:
        static_assert(int(NestingTooDeep) == int(CborErrorNestingTooDeep));
        return QStringLiteral("Internal limitation: data nesting too deep");
    case UnsupportedType:
        static_assert(int(UnsupportedType) == int(CborErrorUnsupportedType));
        return QStringLiteral("Internal limitation: unsupported type");
    }

    // get the error string from TinyCBOR
    CborError err = CborError(int(c));
    return QString::fromLatin1(cbor_error_string(err));
}